

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O1

sc_uint_subref * __thiscall sc_dt::sc_uint_subref::operator=(sc_uint_subref *this,sc_signed *a)

{
  byte bVar1;
  sc_uint_base *psVar2;
  int iVar3;
  ulong uVar4;
  sc_uint_base aa;
  sc_uint_base local_28;
  
  iVar3 = (this->super_sc_uint_subref_r).m_left - (this->super_sc_uint_subref_r).m_right;
  local_28.m_len = iVar3 + 1;
  local_28.super_sc_value_base._vptr_sc_value_base = (_func_int **)&PTR_concat_clear_data_0026e378;
  local_28.m_val = 0;
  local_28.m_ulen = 0x3f - iVar3;
  if (0xffffffbf < iVar3 - 0x40U) {
    sc_uint_base::operator=(&local_28,a);
    psVar2 = (this->super_sc_uint_subref_r).m_obj_p;
    iVar3 = (this->super_sc_uint_subref_r).m_right;
    uVar4 = local_28.m_val << ((byte)iVar3 & 0x3f);
    bVar1 = (byte)psVar2->m_ulen;
    psVar2->m_val =
         (((psVar2->m_val ^ uVar4) &
           *(ulong *)(mask_int +
                     (long)iVar3 * 8 + (long)(this->super_sc_uint_subref_r).m_left * 0x200) ^ uVar4)
         << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
    return this;
  }
  sc_uint_base::invalid_length(&local_28);
}

Assistant:

void
sc_uint_base::invalid_index( int i ) const
{
    std::stringstream msg;
    msg << "sc_uint[_base] bit selection: index = " << i
        << " violates 0 <= index <= " << (m_len - 1);
    SC_REPORT_ERROR( sc_core::SC_ID_OUT_OF_BOUNDS_, msg.str().c_str() );
    sc_core::sc_abort(); // can't recover from here
}